

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictTrie.hpp
# Opt level: O0

void __thiscall cppjieba::DictTrie::SetStaticWordWeights(DictTrie *this,UserWordWeightOption option)

{
  bool bVar1;
  ostream *poVar2;
  reference pvVar3;
  size_type sVar4;
  int in_ESI;
  __normal_iterator<cppjieba::DictUnit_*,_std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>_>
  in_RDI;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> x;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_stack_fffffffffffffe08;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *this_00;
  Logger *in_stack_fffffffffffffe20;
  __normal_iterator<cppjieba::DictUnit_*,_std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>_>
  in_stack_fffffffffffffe28;
  Logger *in_stack_fffffffffffffe40;
  pointer in_stack_fffffffffffffe58;
  vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe9c;
  char *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffea8;
  Logger *in_stack_fffffffffffffeb0;
  
  bVar1 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::empty
                    ((vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)
                     in_stack_fffffffffffffe20);
  if (bVar1) {
    in_stack_fffffffffffffe20 = (Logger *)&stack0xfffffffffffffe70;
    limonp::Logger::Logger
              (in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
               in_stack_fffffffffffffe9c);
    poVar2 = limonp::Logger::Stream(in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe28._M_current =
         (DictUnit *)std::operator<<(poVar2,"exp: [!static_node_infos_.empty()");
    std::operator<<((ostream *)in_stack_fffffffffffffe28._M_current,"] false. ");
    limonp::Logger::~Logger(in_stack_fffffffffffffe40);
  }
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::vector
            (in_stack_fffffffffffffe60,
             (vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)
             in_stack_fffffffffffffe58);
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::begin
            (in_stack_fffffffffffffe08);
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::end
            (in_stack_fffffffffffffe08);
  std::
  sort<__gnu_cxx::__normal_iterator<cppjieba::DictUnit*,std::vector<cppjieba::DictUnit,std::allocator<cppjieba::DictUnit>>>,bool(*)(cppjieba::DictUnit_const&,cppjieba::DictUnit_const&)>
            (in_RDI,in_stack_fffffffffffffe28,
             (_func_bool_DictUnit_ptr_DictUnit_ptr *)in_stack_fffffffffffffe20);
  this_00 = (vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)
            &stack0xfffffffffffffe48;
  pvVar3 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::operator[]
                     (this_00,0);
  *(double *)((long)&((in_RDI._M_current)->tag).field_2 + 8) = pvVar3->weight;
  sVar4 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::size(this_00);
  pvVar3 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::operator[]
                     (this_00,sVar4 - 1);
  *(double *)in_RDI._M_current[1].word.buffer_ = pvVar3->weight;
  sVar4 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::size(this_00);
  pvVar3 = std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::operator[]
                     (this_00,sVar4 >> 1);
  *(double *)(in_RDI._M_current[1].word.buffer_ + 2) = pvVar3->weight;
  if (in_ESI == 0) {
    *(undefined8 *)(in_RDI._M_current[1].word.buffer_ + 4) =
         *(undefined8 *)((long)&((in_RDI._M_current)->tag).field_2 + 8);
  }
  else if (in_ESI == 1) {
    *(undefined8 *)(in_RDI._M_current[1].word.buffer_ + 4) =
         *(undefined8 *)(in_RDI._M_current[1].word.buffer_ + 2);
  }
  else {
    *(undefined8 *)(in_RDI._M_current[1].word.buffer_ + 4) =
         *(undefined8 *)in_RDI._M_current[1].word.buffer_;
  }
  std::vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_>::~vector
            ((vector<cppjieba::DictUnit,_std::allocator<cppjieba::DictUnit>_> *)
             in_stack_fffffffffffffe20);
  return;
}

Assistant:

void SetStaticWordWeights(UserWordWeightOption option) {
    XCHECK(!static_node_infos_.empty());
    vector<DictUnit> x = static_node_infos_;
    sort(x.begin(), x.end(), WeightCompare);
    min_weight_ = x[0].weight;
    max_weight_ = x[x.size() - 1].weight;
    median_weight_ = x[x.size() / 2].weight;
    switch (option) {
     case WordWeightMin:
       user_word_default_weight_ = min_weight_;
       break;
     case WordWeightMedian:
       user_word_default_weight_ = median_weight_;
       break;
     default:
       user_word_default_weight_ = max_weight_;
       break;
    }
  }